

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

STRING_HANDLE make_product_info(char *product,PLATFORM_INFO_OPTION option)

{
  STRING_HANDLE handle;
  char *pcVar1;
  STRING_HANDLE pSVar2;
  LOGGER_LOG p_Var3;
  
  handle = platform_get_platform_info(option);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      pSVar2 = (STRING_HANDLE)0x0;
    }
    else {
      pSVar2 = (STRING_HANDLE)0x0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"make_product_info",0x205,1,"Platform get info failed");
    }
  }
  else {
    pcVar1 = STRING_c_str(handle);
    if (product == (char *)0x0) {
      pSVar2 = STRING_construct_sprintf("%s %s","iothubclient/1.15.0",pcVar1);
    }
    else {
      pSVar2 = STRING_construct_sprintf("%s %s %s",product,"iothubclient/1.15.0",pcVar1);
    }
    STRING_delete(handle);
  }
  return pSVar2;
}

Assistant:

static STRING_HANDLE make_product_info(const char* product, PLATFORM_INFO_OPTION option)
{
    STRING_HANDLE result;
    STRING_HANDLE pfi = platform_get_platform_info(option);
    if (pfi == NULL)
    {
        LogError("Platform get info failed");
        result = NULL;
    }
    else
    {
        if (product == NULL)
        {
            result = STRING_construct_sprintf("%s %s", CLIENT_DEVICE_TYPE_PREFIX CLIENT_DEVICE_BACKSLASH IOTHUB_SDK_VERSION, STRING_c_str(pfi));
        }
        else
        {
            result = STRING_construct_sprintf("%s %s %s", product, CLIENT_DEVICE_TYPE_PREFIX CLIENT_DEVICE_BACKSLASH IOTHUB_SDK_VERSION, STRING_c_str(pfi));
        }
        STRING_delete(pfi);
    }
    return result;
}